

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereClauseInsert(WhereClause *pWC,Expr *p,u16 wtFlags)

{
  int iVar1;
  sqlite3 *db;
  LogEst LVar2;
  short sVar3;
  uint uVar4;
  WhereTerm *__dest;
  WhereTerm *pWVar5;
  ExprList_item *pEVar6;
  
  if (pWC->nSlot <= pWC->nTerm) {
    pWVar5 = pWC->a;
    db = pWC->pWInfo->pParse->db;
    __dest = (WhereTerm *)sqlite3DbMallocRawNN(db,(long)pWC->nSlot << 7);
    pWC->a = __dest;
    if (__dest == (WhereTerm *)0x0) {
      if (p != (Expr *)0x0 && (wtFlags & 1) != 0) {
        sqlite3ExprDeleteNN(db,p);
      }
      pWC->a = pWVar5;
    }
    else {
      memcpy(__dest,pWVar5,(long)pWC->nTerm << 6);
      if (pWVar5 != (WhereTerm *)0x0 && pWVar5 != pWC->aStatic) {
        sqlite3DbFreeNN(db,pWVar5);
      }
      pWVar5 = pWC->a;
      if (((db == (sqlite3 *)0x0) || (pWVar5 < (WhereTerm *)(db->lookaside).pStart)) ||
         ((WhereTerm *)(db->lookaside).pEnd <= pWVar5)) {
        uVar4 = (*sqlite3Config.m.xSize)(pWVar5);
      }
      else {
        uVar4 = (uint)(db->lookaside).sz;
      }
      pWC->nSlot = (int)uVar4 >> 6;
    }
    if (__dest == (WhereTerm *)0x0) {
      return 0;
    }
  }
  iVar1 = pWC->nTerm;
  pWC->nTerm = iVar1 + 1;
  pWVar5 = pWC->a + iVar1;
  if (p == (Expr *)0x0) {
    pWVar5->truthProb = 1;
  }
  else {
    sVar3 = 1;
    if ((p->flags & 0x40000) != 0) {
      LVar2 = sqlite3LogEst((long)p->iTable);
      sVar3 = LVar2 + -0x10e;
    }
    pWVar5->truthProb = sVar3;
    while ((p != (Expr *)0x0 && ((p->flags >> 0xc & 1) != 0))) {
      if ((p->flags >> 0x12 & 1) == 0) {
        pEVar6 = (ExprList_item *)&p->pLeft;
      }
      else {
        pEVar6 = ((p->x).pList)->a;
      }
      p = pEVar6->pExpr;
    }
  }
  pWVar5->pExpr = p;
  pWVar5->wtFlags = wtFlags;
  pWVar5->pWC = pWC;
  pWVar5->eOperator = 0;
  pWVar5->nChild = '\0';
  pWVar5->eMatchOp = '\0';
  pWVar5->iParent = 0;
  pWVar5->leftCursor = 0;
  pWVar5->iField = 0;
  *(undefined8 *)&pWVar5->field_0x24 = 0;
  *(undefined8 *)((long)&pWVar5->u + 4) = 0;
  pWVar5->prereqRight = 0;
  pWVar5->prereqAll = 0;
  return iVar1;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u16 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pWInfo->pParse->db;
    pWC->a = sqlite3DbMallocRawNN(db, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    if( pOld!=pWC->aStatic ){
      sqlite3DbFree(db, pOld);
    }
    pWC->nSlot = sqlite3DbMallocSize(db, pWC->a)/sizeof(pWC->a[0]);
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  if( p && ExprHasProperty(p, EP_Unlikely) ){
    pTerm->truthProb = sqlite3LogEst(p->iTable) - 270;
  }else{
    pTerm->truthProb = 1;
  }
  pTerm->pExpr = sqlite3ExprSkipCollate(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  memset(&pTerm->eOperator, 0,
         sizeof(WhereTerm) - offsetof(WhereTerm,eOperator));
  return idx;
}